

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_defines.hpp
# Opt level: O1

type_conflict4 *
chaiscript::parse_num<long_double>(type_conflict4 *__return_storage_ptr__,string_view t_str)

{
  byte bVar1;
  float fVar2;
  type_conflict4 *ptVar3;
  type_conflict4 *ptVar4;
  char *pcVar5;
  
  pcVar5 = t_str._M_str;
  if (__return_storage_ptr__ == (type_conflict4 *)0x0) {
    ptVar3 = (type_conflict4 *)0x0;
  }
  else {
    ptVar4 = (type_conflict4 *)0x0;
    ptVar3 = (type_conflict4 *)0x0;
    fVar2 = 0.0;
    do {
      bVar1 = *(byte *)(t_str._M_len + (long)ptVar4);
      pcVar5 = (char *)(ulong)bVar1;
      if (bVar1 - 0x30 < 10) {
        if (10.0 <= fVar2) {
          pcVar5 = (char *)(ulong)((int)(char)bVar1 - 0x30);
          fVar2 = fVar2 * 10.0;
        }
        else {
          pcVar5 = (char *)(ulong)((int)(char)bVar1 - 0x30);
        }
      }
      else if (bVar1 < 0x45) {
        if (bVar1 == 0x2d) {
          ptVar3 = (type_conflict4 *)0xffffffff;
        }
        else if (bVar1 == 0x2e) {
          fVar2 = 10.0;
        }
      }
      else if ((bVar1 == 0x45) || (bVar1 == 0x65)) {
        ptVar3 = (type_conflict4 *)0x1;
        fVar2 = 0.0;
      }
      ptVar4 = (type_conflict4 *)((long)ptVar4 + 1);
    } while (__return_storage_ptr__ != ptVar4);
  }
  if ((int)ptVar3 != 0) {
    ptVar3 = (type_conflict4 *)powl(__return_storage_ptr__,t_str._M_len,pcVar5);
  }
  return ptVar3;
}

Assistant:

[[nodiscard]] auto parse_num(const std::string_view t_str) -> typename std::enable_if<!std::is_integral<T>::value, T>::type {
    T t = 0;
    T base{};
    T decimal_place = 0;
    int exponent = 0;

    for (const auto c : t_str) {
      switch (c) {
        case '.':
          decimal_place = 10;
          break;
        case 'e':
        case 'E':
          exponent = 1;
          decimal_place = 0;
          base = t;
          t = 0;
          break;
        case '-':
          exponent = -1;
          break;
        case '+':
          break;
        case '0':
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7':
        case '8':
        case '9':
          if (decimal_place < 10) {
            t *= 10;
            t += static_cast<T>(c - '0');
          } else {
            t += static_cast<T>(c - '0') / decimal_place;
            decimal_place *= 10;
          }
          break;
        default:
          break;
      }
    }
    return exponent ? base * std::pow(T(10), t * static_cast<T>(exponent)) : t;
  }